

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# askf_tx.c
# Opt level: O2

int tio_askfile(char *prompt,char *reply,int replen,int prompt_type,os_filetype_t file_type)

{
  int iVar1;
  
  outformat(prompt);
  iVar1 = getstring(" >",reply,replen);
  if (iVar1 == 0) {
    iVar1 = (uint)(*reply == '\0') * 2;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int tio_askfile(const char *prompt, char *reply, int replen,
                int prompt_type, os_filetype_t file_type)
{
    /* show the prompt */
    outformat((char *)prompt);

    /* ask for the filename */
    if (getstring(" >", reply, replen))
        return OS_AFE_FAILURE;
    
    /* 
     *   if they entered an empty line, return "cancel"; otherwise, return
     *   success 
     */
    return (reply[0] == '\0' ? OS_AFE_CANCEL : OS_AFE_SUCCESS);
}